

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

void __thiscall Catch::Clara::Detail::BasicResult<void>::enforceOk(BasicResult<void> *this)

{
  ResultType RVar1;
  
  RVar1 = (this->super_ResultValueBase<void>).super_ResultBase.m_type;
  if (RVar1 == Ok) {
    return;
  }
  if (RVar1 != RuntimeError) {
    if (RVar1 == LogicError) {
      __assert_fail("m_type != ResultType::LogicError",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                    ,0x1244,
                    "virtual void Catch::Clara::Detail::BasicResult<>::enforceOk() const [T = void]"
                   );
    }
    abort();
  }
  __assert_fail("m_type != ResultType::RuntimeError",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                ,0x1245,
                "virtual void Catch::Clara::Detail::BasicResult<>::enforceOk() const [T = void]");
}

Assistant:

void enforceOk() const override {

                    // Errors shouldn't reach this point, but if they do
                    // the actual error message will be in m_errorMessage
                    assert( m_type != ResultType::LogicError );
                    assert( m_type != ResultType::RuntimeError );
                    if ( m_type != ResultType::Ok )
                        std::abort();
                }